

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::BitwiseOrFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  bool bVar3;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *function;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::ScalarFunction,_true> *__range1_1;
  LogicalType *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  ScalarFunctionSet *functions;
  ScalarFunction *in_stack_fffffffffffffa48;
  ScalarFunction *function_00;
  ScalarFunction *in_stack_fffffffffffffa50;
  ScalarFunction *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  LogicalTypeId in_stack_fffffffffffffa6f;
  LogicalType *in_stack_fffffffffffffa70;
  ScalarFunctionSet *in_stack_fffffffffffffa90;
  undefined1 **local_550;
  LogicalType *in_stack_fffffffffffffaf8;
  bind_scalar_function_extended_t in_stack_fffffffffffffb70;
  bind_scalar_function_t in_stack_fffffffffffffb78;
  scalar_function_t *in_stack_fffffffffffffb80;
  LogicalType *in_stack_fffffffffffffb88;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffb90;
  ScalarFunction *in_stack_fffffffffffffb98;
  function_statistics_t in_stack_fffffffffffffbd0;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  in_stack_fffffffffffffbd8;
  LogicalType *in_stack_fffffffffffffbe0;
  FunctionStability in_stack_fffffffffffffbe8;
  FunctionNullHandling in_stack_fffffffffffffbf0;
  bind_lambda_function_t in_stack_fffffffffffffbf8;
  undefined1 *local_3b8 [6];
  undefined8 *local_388;
  undefined8 local_380;
  undefined1 local_238 [88];
  LogicalType *local_1e0;
  LogicalType local_1d8;
  undefined1 local_1c0 [24];
  LogicalType *local_1a8;
  element_type *local_1a0;
  reference local_58;
  LogicalType *local_50;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_48 [3];
  undefined1 local_30 [24];
  undefined1 *local_18;
  undefined1 local_9;
  
  local_9 = 0;
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffffa90);
  LogicalType::Integral();
  local_18 = local_30;
  local_48[0]._M_current =
       (LogicalType *)
       ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                 ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                  in_stack_fffffffffffffa48);
  local_50 = (LogicalType *)
             ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                       ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                        in_stack_fffffffffffffa48);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)in_stack_fffffffffffffa50,
                            (__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)in_stack_fffffffffffffa48), bVar3) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
               ::operator*(local_48);
    local_1e0 = &local_1d8;
    LogicalType::LogicalType
              ((LogicalType *)in_stack_fffffffffffffa50,(LogicalType *)in_stack_fffffffffffffa48);
    local_1e0 = (LogicalType *)local_1c0;
    LogicalType::LogicalType
              ((LogicalType *)in_stack_fffffffffffffa50,(LogicalType *)in_stack_fffffffffffffa48);
    local_1a8 = &local_1d8;
    local_1a0 = (element_type *)0x2;
    ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x20dad80);
    iVar1._M_len._0_4_ = in_stack_fffffffffffffa60;
    iVar1._M_array = (iterator)in_stack_fffffffffffffa58;
    iVar1._M_len._4_4_ = in_stack_fffffffffffffa64;
    vector<duckdb::LogicalType,_true>::vector
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffa50,iVar1,
               (allocator_type *)in_stack_fffffffffffffa48);
    LogicalType::LogicalType
              ((LogicalType *)in_stack_fffffffffffffa50,(LogicalType *)in_stack_fffffffffffffa48);
    GetScalarIntegerBinaryFunction<duckdb::BitwiseOROperator>(in_stack_fffffffffffffaf8);
    LogicalType::LogicalType(in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f);
    in_stack_fffffffffffffa58 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_238
    ;
    in_stack_fffffffffffffa70 = (LogicalType *)0x0;
    in_stack_fffffffffffffa60 = 0;
    in_stack_fffffffffffffa50 = (ScalarFunction *)0x0;
    in_stack_fffffffffffffa48 = (ScalarFunction *)0x0;
    ScalarFunction::ScalarFunction
              (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
               in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               in_stack_fffffffffffffbd0,(init_local_state_t)in_stack_fffffffffffffbd8._M_current,
               in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbf8);
    FunctionSet<duckdb::ScalarFunction>::AddFunction
              ((FunctionSet<duckdb::ScalarFunction> *)in_stack_fffffffffffffa50,
               in_stack_fffffffffffffa48);
    ScalarFunction::~ScalarFunction(in_stack_fffffffffffffa50);
    LogicalType::~LogicalType((LogicalType *)0x20dae7a);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0x20dae87);
    LogicalType::~LogicalType((LogicalType *)0x20dae94);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x20daea1);
    ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x20daeae);
    in_stack_fffffffffffffaf8 = (LogicalType *)&local_1a8;
    do {
      in_stack_fffffffffffffaf8 = in_stack_fffffffffffffaf8 + -1;
      LogicalType::~LogicalType((LogicalType *)0x20daee3);
    } while (in_stack_fffffffffffffaf8 != &local_1d8);
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++(local_48);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x20dacde);
  LogicalType::LogicalType(in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f);
  LogicalType::LogicalType(in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f);
  local_388 = local_3b8;
  local_380 = 2;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x20db11c);
  iVar2._M_len._0_4_ = in_stack_fffffffffffffa60;
  iVar2._M_array = (iterator)in_stack_fffffffffffffa58;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffa64;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffa50,iVar2,
             (allocator_type *)in_stack_fffffffffffffa48);
  LogicalType::LogicalType(in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),in_stack_fffffffffffffa58
            );
  LogicalType::LogicalType(in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f);
  this = (ScalarFunction *)0x0;
  function_00 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
             in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
             in_stack_fffffffffffffbd0,(init_local_state_t)in_stack_fffffffffffffbd8._M_current,
             in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbf0,
             in_stack_fffffffffffffbf8);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function_00);
  ScalarFunction::~ScalarFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x20db20d);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x20db21a);
  LogicalType::~LogicalType((LogicalType *)0x20db227);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x20db234);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x20db241);
  local_550 = (undefined1 **)&local_388;
  do {
    local_550 = local_550 + -3;
    LogicalType::~LogicalType((LogicalType *)0x20db26a);
  } while (local_550 != local_3b8);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)function_00)
  ;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)function_00)
  ;
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)this,(__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                                     *)function_00), bVar3) {
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator*((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                 *)&stack0xfffffffffffffbd8);
    BaseScalarFunction::SetReturnsError(&function_00->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&this->super_BaseScalarFunction);
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator++((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                  *)&stack0xfffffffffffffbd8);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet BitwiseOrFun::GetFunctions() {
	ScalarFunctionSet functions;
	for (auto &type : LogicalType::Integral()) {
		functions.AddFunction(
		    ScalarFunction({type, type}, type, GetScalarIntegerBinaryFunction<BitwiseOROperator>(type)));
	}
	functions.AddFunction(ScalarFunction({LogicalType::BIT, LogicalType::BIT}, LogicalType::BIT, BitwiseOROperation));
	for (auto &function : functions.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}